

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

float __thiscall
xatlas::internal::segment::Atlas::evaluateStraightnessMetric
          (Atlas *this,Chart *chart,uint32_t firstFace)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint *puVar4;
  float *pfVar5;
  int *piVar6;
  float fVar7;
  float local_54;
  float local_50;
  float local_4c;
  float ratio;
  float l;
  FaceEdgeIterator it;
  uint32_t face;
  uint32_t planarRegionId;
  float l_in;
  float l_out;
  uint32_t firstFace_local;
  Chart *chart_local;
  Atlas *this_local;
  
  planarRegionId = 0;
  face = 0;
  puVar4 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,firstFace);
  uVar1 = *puVar4;
  it._20_4_ = firstFace;
  do {
    Mesh::FaceEdgeIterator::FaceEdgeIterator((FaceEdgeIterator *)&ratio,this->m_mesh,it._20_4_);
    while (bVar2 = Mesh::FaceEdgeIterator::isDone((FaceEdgeIterator *)&ratio),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      uVar3 = Mesh::FaceEdgeIterator::edge((FaceEdgeIterator *)&ratio);
      pfVar5 = Array<float>::operator[](&this->m_edgeLengths,uVar3);
      local_4c = *pfVar5;
      bVar2 = Mesh::FaceEdgeIterator::isBoundary((FaceEdgeIterator *)&ratio);
      if (bVar2) {
        planarRegionId = (uint32_t)(local_4c + (float)planarRegionId);
      }
      else {
        uVar3 = Mesh::FaceEdgeIterator::oppositeFace((FaceEdgeIterator *)&ratio);
        puVar4 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,uVar3);
        if (*puVar4 != uVar1) {
          uVar3 = Mesh::FaceEdgeIterator::oppositeFace((FaceEdgeIterator *)&ratio);
          piVar6 = Array<int>::operator[](&this->m_faceCharts,uVar3);
          if (*piVar6 == chart->id) {
            face = (uint32_t)(local_4c + (float)face);
          }
          else {
            planarRegionId = (uint32_t)(local_4c + (float)planarRegionId);
          }
        }
      }
      Mesh::FaceEdgeIterator::advance((FaceEdgeIterator *)&ratio);
    }
    puVar4 = Array<unsigned_int>::operator[](&this->m_nextPlanarRegionFace,it._20_4_);
    it._20_4_ = *puVar4;
  } while (it._20_4_ != firstFace);
  if (((float)face == 0.0) && (!NAN((float)face))) {
    __assert_fail("l_in != 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x157f,
                  "float xatlas::internal::segment::Atlas::evaluateStraightnessMetric(Chart *, uint32_t) const"
                 );
  }
  local_50 = ((float)planarRegionId - (float)face) / ((float)planarRegionId + (float)face);
  local_54 = 0.0;
  fVar7 = min<float>(&local_50,&local_54);
  return fVar7;
}

Assistant:

float evaluateStraightnessMetric(Chart *chart, uint32_t firstFace) const
	{
		float l_out = 0.0f, l_in = 0.0f;
		const uint32_t planarRegionId = m_facePlanarRegionId[firstFace];
		uint32_t face = firstFace;
		for (;;) { 
			for (Mesh::FaceEdgeIterator it(m_mesh, face); !it.isDone(); it.advance()) {
				const float l = m_edgeLengths[it.edge()];
				if (it.isBoundary()) {
					l_out += l;
				} else if (m_facePlanarRegionId[it.oppositeFace()] != planarRegionId) {
					if (m_faceCharts[it.oppositeFace()] != chart->id)
						l_out += l;
					else
						l_in += l;
				}
			}
			face = m_nextPlanarRegionFace[face];
			if (face == firstFace)
				break;
		}
		XA_DEBUG_ASSERT(l_in != 0.0f); // Candidate face must be adjacent to chart. @@ This is not true if the input mesh has zero-length edges.
		float ratio = (l_out - l_in) / (l_out + l_in);
		return min(ratio, 0.0f); // Only use the straightness metric to close gaps.
	}